

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretInit.c
# Opt level: O2

void Abc_FlowRetime_UpdateForwardInit_rec(Abc_Obj_t *pObj)

{
  Abc_NtkFunc_t AVar1;
  Abc_Ntk_t *pAVar2;
  DdManager *dd;
  void *pvVar3;
  int *piVar4;
  void **ppvVar5;
  Flow_Data_t FVar6;
  Flow_Data_t FVar7;
  uint uVar8;
  int iVar9;
  undefined8 in_RAX;
  DdNode *pDVar10;
  DdNode *f;
  Hop_Obj_t *pHVar11;
  char *pSop;
  int *in_RCX;
  uint dc;
  ulong uVar12;
  long lVar13;
  undefined8 local_38;
  
  uVar8 = *(uint *)&pObj->field_0x14 & 0xf;
  if (uVar8 == 5) {
    return;
  }
  if (uVar8 == 2) {
    __assert_fail("!Abc_ObjIsPi(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretInit.c"
                  ,0xbc,"void Abc_FlowRetime_UpdateForwardInit_rec(Abc_Obj_t *)");
  }
  local_38 = in_RAX;
  iVar9 = Abc_NodeIsTravIdCurrent(pObj);
  if (iVar9 != 0) {
    return;
  }
  Abc_NodeSetTravIdCurrent(pObj);
  for (lVar13 = 0; pAVar2 = pObj->pNtk, lVar13 < (pObj->vFanins).nSize; lVar13 = lVar13 + 1) {
    in_RCX = (int *)(long)(pObj->vFanins).pArray[lVar13];
    Abc_FlowRetime_UpdateForwardInit_rec((Abc_Obj_t *)pAVar2->vObjs->pArray[(long)in_RCX]);
  }
  uVar12 = (ulong)*(uint *)&pObj->field_0x14;
  if ((*(uint *)&pObj->field_0x14 & 0xf) == 8) {
    __assert_fail("!Abc_ObjIsLatch(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretInit.c"
                  ,0x12f,"void Abc_FlowRetime_SimulateNode(Abc_Obj_t *)");
  }
  if (pObj < (Abc_Obj_t *)0x2) {
    __assert_fail("Abc_ObjRegular(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretInit.c"
                  ,0x130,"void Abc_FlowRetime_SimulateNode(Abc_Obj_t *)");
  }
  dd = (DdManager *)pAVar2->pManFunc;
  f = (DdNode *)(pObj->field_5).pData;
  if (pAVar2->ntkType == ABC_NTK_STRASH) {
    iVar9 = Abc_AigNodeIsConst(pObj);
    if (iVar9 != 0) {
LAB_0041134a:
      uVar8 = 1;
LAB_00411377:
      dc = 0;
      goto LAB_00411405;
    }
    uVar12 = (ulong)*(uint *)&pObj->field_0x14;
    if (pAVar2->ntkType != ABC_NTK_STRASH) goto LAB_0041135c;
  }
  else {
LAB_0041135c:
    if (((uint)uVar12 & 0xf) == 7) {
      iVar9 = Abc_NodeIsConst0(pObj);
      if (iVar9 != 0) {
        uVar8 = 0;
        goto LAB_00411377;
      }
      iVar9 = Abc_NodeIsConst1(pObj);
      if (iVar9 != 0) goto LAB_0041134a;
      uVar12 = (ulong)*(uint *)&pObj->field_0x14;
    }
  }
  uVar8 = (uint)uVar12;
  if ((uVar8 & 0xf) == 7) {
    AVar1 = pAVar2->ntkFunc;
    if (AVar1 == ABC_FUNC_AIG) {
      if (pAVar2->ntkType != ABC_NTK_STRASH) {
        if ((pObj->field_5).pData == (void *)0x0) {
          __assert_fail("pObj->pData",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretInit.c"
                        ,0x172,"void Abc_FlowRetime_SimulateNode(Abc_Obj_t *)");
        }
        iVar9 = (pObj->vFanins).nSize;
        if (iVar9 <= *(int *)&dd->acache) {
          for (lVar13 = 0; lVar13 < iVar9; lVar13 = lVar13 + 1) {
            pvVar3 = pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar13]];
            uVar8 = *(uint *)(pManMR->pDataArray + *(uint *)((long)pvVar3 + 0x10));
            pHVar11 = Hop_ManPi((Hop_Man_t *)dd,(int)lVar13);
            *(uint *)&pHVar11->field_0x20 =
                 *(uint *)&pHVar11->field_0x20 & 0xffffffef | uVar8 >> 2 & 0x10;
            FVar6 = pManMR->pDataArray[*(uint *)((long)pvVar3 + 0x10)];
            pHVar11 = Hop_ManPi((Hop_Man_t *)dd,(int)lVar13);
            uVar8 = *(uint *)&pHVar11->field_0x20 & 0xffffffdf |
                    (uint)((undefined1  [24])((undefined1  [24])FVar6 & (undefined1  [24])0x60) !=
                          (undefined1  [24])0x0) << 5;
            in_RCX = (int *)(ulong)uVar8;
            *(uint *)&pHVar11->field_0x20 = uVar8;
            iVar9 = (pObj->vFanins).nSize;
          }
          Abc_FlowRetime_EvalHop_rec
                    ((Hop_Man_t *)(pObj->field_5).pData,(Hop_Obj_t *)((long)&local_38 + 4),
                     (int *)&local_38,in_RCX);
          Abc_FlowRetime_SetInitValue(pObj,local_38._4_4_,(int)local_38);
          for (iVar9 = 0; iVar9 < (pObj->vFanins).nSize; iVar9 = iVar9 + 1) {
            pHVar11 = Hop_ManPi((Hop_Man_t *)dd,iVar9);
            pHVar11->field_0x20 = pHVar11->field_0x20 & 0xef;
            pHVar11 = Hop_ManPi((Hop_Man_t *)dd,iVar9);
            pHVar11->field_0x20 = pHVar11->field_0x20 & 0xdf;
          }
          return;
        }
        __assert_fail("Abc_ObjFaninNum(pObj) <= Hop_ManPiNum(pHop)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretInit.c"
                      ,0x173,"void Abc_FlowRetime_SimulateNode(Abc_Obj_t *)");
      }
    }
    else {
      if (AVar1 == ABC_FUNC_BDD) {
        if (dd == (DdManager *)0x0) {
          __assert_fail("dd",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretInit.c"
                        ,0x155,"void Abc_FlowRetime_SimulateNode(Abc_Obj_t *)");
        }
        if (f == (DdNode *)0x0) {
          __assert_fail("pBdd",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretInit.c"
                        ,0x156,"void Abc_FlowRetime_SimulateNode(Abc_Obj_t *)");
        }
        for (lVar13 = 0; lVar13 < (pObj->vFanins).nSize; lVar13 = lVar13 + 1) {
          pvVar3 = pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar13]];
          pDVar10 = Cudd_bddIthVar(dd,(int)lVar13);
          if ((undefined1  [24])
              ((undefined1  [24])pManMR->pDataArray[*(uint *)((long)pvVar3 + 0x10)] &
              (undefined1  [24])0x60) != (undefined1  [24])0x0) {
            if ((undefined1  [24])
                ((undefined1  [24])pManMR->pDataArray[*(uint *)((long)pvVar3 + 0x10)] &
                (undefined1  [24])0x20) != (undefined1  [24])0x0) {
              pDVar10 = (DdNode *)((ulong)pDVar10 ^ 1);
            }
            f = Cudd_Cofactor(dd,f,pDVar10);
          }
        }
        pDVar10 = Cudd_ReadOne(dd);
        uVar8 = (uint)(f == pDVar10);
        dc = (uint)(*(int *)((ulong)f & 0xfffffffffffffffe) != 0x7fffffff);
        goto LAB_00411405;
      }
      if (AVar1 == ABC_FUNC_SOP) {
        pSop = (char *)(pObj->field_5).pData;
LAB_00411623:
        Abc_FlowRetime_SimulateSop(pObj,pSop);
        return;
      }
      if (pAVar2->ntkType != ABC_NTK_STRASH) {
        if (AVar1 != ABC_FUNC_MAP) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretInit.c"
                        ,0x1a6,"void Abc_FlowRetime_SimulateNode(Abc_Obj_t *)");
        }
        pSop = Mio_GateReadSop((Mio_Gate_t *)(pObj->field_5).pData);
        goto LAB_00411623;
      }
    }
    piVar4 = (pObj->vFanins).pArray;
    ppvVar5 = pObj->pNtk->vObjs->pArray;
    FVar6 = pManMR->pDataArray[*(uint *)((long)ppvVar5[*piVar4] + 0x10)];
    FVar7 = pManMR->pDataArray[*(uint *)((long)ppvVar5[piVar4[1]] + 0x10)];
    uVar8 = (uVar8 >> 0xb & 1 ^
            (uint)((undefined1  [24])((undefined1  [24])FVar7 & (undefined1  [24])0x20) ==
                  (undefined1  [24])0x0)) &
            ((uint)(uVar12 >> 10) ^
            (uint)((undefined1  [24])((undefined1  [24])FVar6 & (undefined1  [24])0x20) ==
                  (undefined1  [24])0x0));
    dc = (uint)((byte)uVar8 &
               ((undefined1  [24])((undefined1  [24])FVar7 & (undefined1  [24])0x60) ==
                (undefined1  [24])0x0 ||
               (undefined1  [24])((undefined1  [24])FVar6 & (undefined1  [24])0x60) ==
               (undefined1  [24])0x0));
  }
  else {
    uVar8 = (uVar8 >> 10 ^
            (uint)(*(ushort *)
                    (pManMR->pDataArray +
                    *(uint *)((long)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray] + 0x10)) >> 6
                  )) & 1;
    dc = (uint)((*(ushort *)
                  (pManMR->pDataArray +
                  *(uint *)((long)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray] + 0x10)) & 0x60
                ) == 0);
  }
LAB_00411405:
  Abc_FlowRetime_SetInitValue(pObj,uVar8,dc);
  return;
}

Assistant:

void Abc_FlowRetime_UpdateForwardInit_rec( Abc_Obj_t * pObj ) {
  Abc_Obj_t *pNext;
  int i;

  assert(!Abc_ObjIsPi(pObj)); // should never reach the inputs

  if (Abc_ObjIsBo(pObj)) return;

  // visited?
  if (Abc_NodeIsTravIdCurrent(pObj)) return;
  Abc_NodeSetTravIdCurrent(pObj);

  Abc_ObjForEachFanin( pObj, pNext, i ) {
    Abc_FlowRetime_UpdateForwardInit_rec( pNext );
  }
  
  Abc_FlowRetime_SimulateNode( pObj );
}